

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

int aom_noise_strength_solver_init(aom_noise_strength_solver_t *solver,int num_bins,int bit_depth)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  void *in_RDI;
  undefined4 local_4;
  
  if (in_RDI == (void *)0x0) {
    local_4 = 0;
  }
  else {
    memset(in_RDI,0,0x40);
    *(undefined4 *)((long)in_RDI + 0x30) = in_ESI;
    *(undefined8 *)((long)in_RDI + 0x20) = 0;
    *(double *)((long)in_RDI + 0x28) = (double)((1 << ((byte)in_EDX & 0x1f)) + -1);
    *(undefined8 *)((long)in_RDI + 0x38) = 0;
    *(undefined4 *)((long)in_RDI + 0x34) = 0;
    local_4 = equation_system_init((aom_equation_system_t *)CONCAT44(in_ESI,in_EDX),0);
  }
  return local_4;
}

Assistant:

int aom_noise_strength_solver_init(aom_noise_strength_solver_t *solver,
                                   int num_bins, int bit_depth) {
  if (!solver) return 0;
  memset(solver, 0, sizeof(*solver));
  solver->num_bins = num_bins;
  solver->min_intensity = 0;
  solver->max_intensity = (1 << bit_depth) - 1;
  solver->total = 0;
  solver->num_equations = 0;
  return equation_system_init(&solver->eqns, num_bins);
}